

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::ConsumerEndpointImpl
          (ConsumerEndpointImpl *this,TracingServiceImpl *service,TaskRunner *task_runner,
          Consumer *consumer,uid_t uid)

{
  (this->super_ConsumerEndpoint)._vptr_ConsumerEndpoint =
       (_func_int **)&PTR__ConsumerEndpointImpl_003c8b10;
  this->task_runner_ = task_runner;
  this->service_ = service;
  this->consumer_ = consumer;
  this->uid_ = uid;
  this->tracing_session_id_ = 0;
  this->observable_events_mask_ = 0;
  (this->observable_events_)._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::ObservableEvents,_std::default_delete<perfetto::protos::gen::ObservableEvents>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::ObservableEvents_*,_std::default_delete<perfetto::protos::gen::ObservableEvents>_>
  .super__Head_base<0UL,_perfetto::protos::gen::ObservableEvents_*,_false>._M_head_impl =
       (ObservableEvents *)0x0;
  base::WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::WeakPtrFactory
            (&this->weak_ptr_factory_,this);
  return;
}

Assistant:

TracingServiceImpl::ConsumerEndpointImpl::ConsumerEndpointImpl(
    TracingServiceImpl* service,
    base::TaskRunner* task_runner,
    Consumer* consumer,
    uid_t uid)
    : task_runner_(task_runner),
      service_(service),
      consumer_(consumer),
      uid_(uid),
      weak_ptr_factory_(this) {}